

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O0

OUT * __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
::Current(OUT *__return_storage_ptr__,
         GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
         *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  pointer ppVar2;
  vector<int,_std::allocator<int>_> *source;
  shared_ptr<linq::IState<int_&>_> local_60;
  undefined1 local_50 [8];
  IEnumerable<int_&> enumerable;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_> adapted;
  GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
  *this_local;
  
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>::
           operator->(&this->current);
  this_00 = &enumerable.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  AdaptView<std::vector<int,std::allocator<int>>&>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>
              *)this_00,(linq *)&ppVar2->second,source);
  linq::IEnumerableCore::operator_cast_to_IEnumerable
            ((IEnumerable<int_&> *)local_50,(IEnumerableCore *)this_00);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>::
           operator->(&this->current);
  bVar1 = ppVar2->first;
  std::shared_ptr<linq::IState<int_&>_>::shared_ptr
            (&local_60,(shared_ptr<linq::IState<int_&>_> *)&enumerable);
  IGrouping<bool,_int_&>::IGrouping(__return_storage_ptr__,(bool)(bVar1 & 1),&local_60);
  std::shared_ptr<linq::IState<int_&>_>::~shared_ptr(&local_60);
  IEnumerable<int_&>::~IEnumerable((IEnumerable<int_&> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

OUT Current() const override 
			{ 
				decltype(auto) adapted = AdaptView(current->second);
				decltype(auto) enumerable = (IEnumerable<VALUE&>)(adapted);
				return OUT{current->first, enumerable.state}; 
			}